

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockAlpha16bitC
               (uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint16 uVar4;
  uint table;
  uint index;
  long lVar5;
  char cVar6;
  uint mul;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  
  iVar3 = formatSigned;
  bVar1 = *data;
  table = data[1] & 0xf;
  mul = (uint)(data[1] >> 4);
  iVar11 = 2;
  iVar12 = 0;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      index = 0;
      cVar6 = '\x05';
      for (iVar8 = -5; iVar8 != -8; iVar8 = iVar8 + -1) {
        iVar9 = iVar12 + 1;
        if (6 < iVar12) {
          iVar9 = 0;
        }
        uVar10 = 1 << ((byte)-(iVar12 + -7) & 0x1f) & (uint)data[iVar11];
        uVar2 = uVar10 << ((char)iVar12 + (char)iVar8 & 0x1fU);
        if (iVar8 + 7 < -(iVar12 + -7)) {
          uVar2 = uVar10 >> (cVar6 - (char)iVar12 & 0x1fU);
        }
        index = index | uVar2 & 0xff;
        iVar11 = iVar11 + (uint)(6 < iVar12);
        cVar6 = cVar6 + '\x01';
        iVar12 = iVar9;
      }
      if (iVar3 == 0) {
        uVar4 = get16bits11bits((uint)bVar1,table,mul,index);
      }
      else {
        uVar4 = get16bits11signed((char)bVar1 + 0x80,table,mul,index);
      }
      *(uint16 *)(img + ((iy + lVar7) * (long)width + ix + lVar5) * (long)channels * 2) = uVar4;
    }
  }
  return;
}

Assistant:

void decompressBlockAlpha16bitC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];

	if(formatSigned) 
	{
		//if we have a signed format, the base value is given as a signed byte. We convert it to (0-255) here,
		//so more code can be shared with the unsigned mode.
		alpha = *((signed char*)(&data[0]));
		alpha = alpha+128;
	}

	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			int windex = channels*(2*(ix+x+(iy+y)*width));
#if !PGMOUT
			if(formatSigned)
			{
				*(int16 *)&img[windex] = get16bits11signed(alpha,(table%16),(table/16),index);
			}
			else
			{
				*(uint16 *)&img[windex] = get16bits11bits(alpha,(table%16),(table/16),index);
			}
#else
			//make data compatible with the .pgm format. See the comment in compressBlockAlpha16() for details.
			uint16 uSixteen;
			if (formatSigned)
			{
				//the pgm-format only allows unsigned images,
				//so we add 2^15 to get a 16-bit value.
				uSixteen = get16bits11signed(alpha,(table%16),(table/16),index) + 256*128;
			}
			else
			{
				uSixteen = get16bits11bits(alpha,(table%16),(table/16),index);
			}
			//byte swap for pgm
			img[windex] = uSixteen/256;
			img[windex+1] = uSixteen%256;
#endif

		}
	}			
}